

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_parse.c
# Opt level: O2

int parse_course_status(course_status *status,char *str)

{
  course_status cVar1;
  int iVar2;
  
  iVar2 = strncmp(str,"OPEN",4);
  if (iVar2 == 0) {
    cVar1 = STATUS_OPEN;
  }
  else {
    iVar2 = strncmp(str,"CLOSE",5);
    if (iVar2 == 0) {
      cVar1 = STATUS_CLOSED;
    }
    else {
      iVar2 = strncmp(str,"CANCEL",6);
      if (iVar2 != 0) {
        return -1;
      }
      cVar1 = STATUS_CANCELLED;
    }
  }
  *status = cVar1;
  return 0;
}

Assistant:

int parse_course_status(enum course_status *status, const char *str)
{
	if (!strncmp(str, "OPEN", 4)) {
		*status = STATUS_OPEN;
	} else if (!strncmp(str, "CLOSE", 5)) {
		*status = STATUS_CLOSED;
	} else if (!strncmp(str, "CANCEL", 6)) {
		*status = STATUS_CANCELLED;
	} else {
		return -1;
	}

	return 0;
}